

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

bool mjs::anon_unknown_35::anon_unknown_5::is_uri_unescaped(int ch)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((9 < ch - 0x30U) && (0x19 < (ch & 0xffffffdfU) - 0x41)) {
    pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       ("-_.!~*\'()","");
    bVar2 = pcVar1 != "";
  }
  return bVar2;
}

Assistant:

constexpr bool is_alpha_or_digit(int ch) {
    return (ch >= 'A' && ch <= 'Z')
        || (ch >= 'a' && ch <= 'z')
        || (ch >= '0' && ch <= '9');
}